

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_container_iterate64
                (bitset_container_t *cont,uint32_t base,roaring_iterator64 iterator,
                uint64_t high_bits,void *ptr)

{
  int iVar1;
  ulong uVar2;
  _Bool _Var3;
  int r;
  uint64_t t;
  uint64_t w;
  int32_t i;
  void *ptr_local;
  uint64_t high_bits_local;
  roaring_iterator64 iterator_local;
  uint32_t base_local;
  bitset_container_t *cont_local;
  
  w._4_4_ = 0;
  iterator_local._4_4_ = base;
  do {
    if (0x3ff < w._4_4_) {
      return true;
    }
    for (t = cont->words[w._4_4_]; t != 0; t = t & (t ^ 0xffffffffffffffff) + 1 ^ t) {
      iVar1 = 0;
      for (uVar2 = t; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
        iVar1 = iVar1 + 1;
      }
      _Var3 = (*iterator)(high_bits | iVar1 + iterator_local._4_4_,ptr);
      if (!_Var3) {
        return false;
      }
    }
    iterator_local._4_4_ = iterator_local._4_4_ + 0x40;
    w._4_4_ = w._4_4_ + 1;
  } while( true );
}

Assistant:

bool bitset_container_iterate64(const bitset_container_t *cont, uint32_t base, roaring_iterator64 iterator, uint64_t high_bits, void *ptr) {
  for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
    uint64_t w = cont->words[i];
    while (w != 0) {
      uint64_t t = w & (~w + 1);
      int r = __builtin_ctzll(w);
      if(!iterator(high_bits | (uint64_t)(r + base), ptr)) return false;
      w ^= t;
    }
    base += 64;
  }
  return true;
}